

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O2

void make_pair(stream_socket *s1,stream_socket *s2)

{
  allocator local_71;
  endpoint local_70 [8];
  string local_68 [32];
  acceptor a;
  
  booster::aio::acceptor::acceptor(&a);
  booster::aio::acceptor::open(&a,1);
  booster::aio::basic_socket::set_option(&a,2,1);
  std::__cxx11::string::string(local_68,"127.0.0.1",&local_71);
  booster::aio::endpoint::endpoint(local_70,local_68,0);
  booster::aio::acceptor::bind((endpoint *)&a);
  booster::aio::endpoint::~endpoint(local_70);
  std::__cxx11::string::~string(local_68);
  booster::aio::acceptor::listen((int)&a);
  booster::aio::stream_socket::open(s1,1);
  booster::aio::basic_socket::local_endpoint();
  booster::aio::stream_socket::connect((endpoint *)s1);
  booster::aio::endpoint::~endpoint((endpoint *)local_68);
  booster::aio::acceptor::accept((stream_socket *)&a);
  booster::aio::basic_io_device::close();
  booster::aio::acceptor::~acceptor(&a);
  return;
}

Assistant:

void make_pair(io::stream_socket &s1,io::stream_socket &s2)
{
	io::acceptor a;
	a.open(io::pf_inet);
    #ifndef BOOSTER_WIN32
	a.set_option(io::stream_socket::reuse_address,true);
    #endif
	a.bind(io::endpoint("127.0.0.1",0));
	a.listen(1);
	s1.open(io::pf_inet);
	s1.connect(a.local_endpoint());
	a.accept(s2);
	a.close();
}